

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_str_to_revision.cpp
# Opt level: O0

void __thiscall StrToRevision_JustWhitespace_Test::TestBody(StrToRevision_JustWhitespace_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_78;
  Message local_70;
  maybe<unsigned_int,_void> local_64 [3];
  allocator local_49;
  string local_48;
  maybe<unsigned_int,_void> local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  StrToRevision_JustWhitespace_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"  \t",&local_49);
  pstore::str_to_revision(&local_28,&local_48);
  pstore::nothing<unsigned_int>();
  testing::internal::EqHelper::
  Compare<pstore::maybe<unsigned_int,_void>,_pstore::maybe<unsigned_int,_void>,_nullptr>
            ((EqHelper *)local_20,"pstore::str_to_revision (\"  \\t\")",
             "pstore::nothing<unsigned> ()",&local_28,local_64);
  pstore::maybe<unsigned_int,_void>::~maybe(local_64);
  pstore::maybe<unsigned_int,_void>::~maybe(&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_str_to_revision.cpp"
               ,0x31,message);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST (StrToRevision, JustWhitespace) {
    EXPECT_EQ (pstore::str_to_revision ("  \t"), pstore::nothing<unsigned> ());
}